

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

string * __thiscall
duckdb::BindContext::AmbiguityException_abi_cxx11_
          (string *__return_storage_ptr__,BindContext *this,BindingAlias *alias,
          vector<std::reference_wrapper<duckdb::Binding>,_true> *bindings)

{
  bool bVar1;
  byte bVar2;
  const_reference pvVar3;
  BindingAlias *other;
  idx_t k;
  ulong __n;
  ulong __n_00;
  BindingAlias *other_00;
  BindingAlias *this_00;
  string minimum_alias;
  string new_minimum_alias;
  undefined1 *local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  BindContext *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_98 = this;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"(use: ",(allocator *)&local_b8);
  for (__n_00 = 0;
      __n_00 < (ulong)((long)((alias->catalog)._M_string_length -
                             (long)(alias->catalog)._M_dataplus._M_p) >> 3); __n_00 = __n_00 + 1) {
    if (__n_00 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    pvVar3 = vector<std::reference_wrapper<duckdb::Binding>,_true>::get<true>
                       ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)alias,__n_00);
    local_b8 = local_a8;
    local_b0 = 0;
    this_00 = &pvVar3->_M_data->alias;
    local_a8[0] = 0;
    bVar2 = 0;
    for (__n = 0; __n < (ulong)((long)((alias->catalog)._M_string_length -
                                      (long)(alias->catalog)._M_dataplus._M_p) >> 3); __n = __n + 1)
    {
      if (__n_00 != __n) {
        other = alias;
        pvVar3 = vector<std::reference_wrapper<duckdb::Binding>,_true>::get<true>
                           ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)alias,__n);
        other_00 = &pvVar3->_M_data->alias;
        bVar1 = BindingAlias::operator==(this_00,other_00);
        MinimumUniqueAlias_abi_cxx11_(&local_50,(duckdb *)this_00,other_00,other);
        if (local_b0 < local_50._M_string_length) {
          ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_50);
        }
        bVar2 = bVar2 | bVar1;
        ::std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if (bVar2 == 0) {
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      BindingAlias::ToString_abi_cxx11_(&local_90,(BindingAlias *)local_98);
      ::std::operator+(&local_70,"(duplicate alias \"",&local_90);
      ::std::operator+(&local_50,&local_70,
                       "\", explicitly alias one of the tables using \"AS my_alias\"");
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string BindContext::AmbiguityException(const BindingAlias &alias, const vector<reference<Binding>> &bindings) {
	D_ASSERT(bindings.size() > 1);
	// found multiple matching aliases
	string result = "(use: ";
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (i > 0) {
			if (i + 1 == bindings.size()) {
				result += " or ";
			} else {
				result += ", ";
			}
		}
		// find the minimum alias that uniquely describes this table reference
		auto &current_alias = bindings[i].get().alias;
		string minimum_alias;
		bool duplicate_alias = false;
		for (idx_t k = 0; k < bindings.size(); k++) {
			if (k == i) {
				continue;
			}
			auto &other_alias = bindings[k].get().alias;
			if (current_alias == other_alias) {
				duplicate_alias = true;
			}
			string new_minimum_alias = MinimumUniqueAlias(current_alias, other_alias);
			if (new_minimum_alias.size() > minimum_alias.size()) {
				minimum_alias = std::move(new_minimum_alias);
			}
		}
		if (duplicate_alias) {
			result = "(duplicate alias \"" + alias.ToString() +
			         "\", explicitly alias one of the tables using \"AS my_alias\"";
		} else {
			result += minimum_alias;
		}
	}
	result += ")";
	return result;
}